

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O1

void __thiscall
testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Matcher(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,string *s)

{
  pointer pcVar1;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long *local_68;
  long local_60;
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014a778;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_60 + (long)local_68);
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014aae0;
  local_80.vtable_ =
       (VTable *)
       internal::MatcherBase<std::__cxx11::string>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::string>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable_abi_cxx11_;
  local_80.buffer_.ptr = operator_new(0x28);
  ((local_80.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_80.buffer_.i + 8) = (undefined8 *)(local_80.buffer_.i + 0x18);
  if (local_48 == &local_38) {
    *(undefined8 *)(local_80.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
    *(undefined8 *)(local_80.buffer_.i + 0x20) = uStack_30;
  }
  else {
    *(undefined1 **)(local_80.buffer_.i + 8) = local_48;
    *(ulong *)(local_80.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
  }
  *(undefined8 *)(local_80.buffer_.i + 0x10) = local_40;
  local_40 = 0;
  local_38 = 0;
  local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0014a778;
  local_48 = &local_38;
  internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&this->
             super_MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&local_80);
  internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_80);
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

Matcher<std::string>::Matcher(const std::string& s) { *this = Eq(s); }